

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLDateTime::parseYearMonth(XMLDateTime *this)

{
  bool bVar1;
  SchemaDateTimeException *this_00;
  XMLCh *local_38;
  XMLDateTime *this_local;
  
  bVar1 = initParser(this);
  if (!bVar1) {
    this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
    if (this->fBuffer == (XMLCh *)0x0) {
      local_38 = L"";
    }
    else {
      local_38 = this->fBuffer;
    }
    SchemaDateTimeException::SchemaDateTimeException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
               ,0x355,DateTime_ym_invalid,local_38,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               this->fMemoryManager);
    __cxa_throw(this_00,&SchemaDateTimeException::typeinfo,
                SchemaDateTimeException::~SchemaDateTimeException);
  }
  getYearMonth(this);
  this->fValue[2] = 0xf;
  parseTimeZone(this);
  validateDateTime(this);
  normalize(this);
  return;
}

Assistant:

void XMLDateTime::parseYearMonth()
{
    if (!initParser())
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_ym_invalid
                , fBuffer ? fBuffer : XMLUni::fgZeroLenString
                , fMemoryManager);

    // get date
    getYearMonth();
    fValue[Day] = DAY_DEFAULT;
    parseTimeZone();

    validateDateTime();
    normalize();
}